

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen2_2x3.cpp
# Opt level: O2

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcClosedShell>
                 (DB *db,LIST *params,IfcClosedShell *in)

{
  size_t sVar1;
  TypeError *this;
  allocator<char> local_39;
  string local_38;
  
  sVar1 = GenericFill<Assimp::IFC::Schema_2x3::IfcConnectedFaceSet>
                    (db,params,&in->super_IfcConnectedFaceSet);
  if ((params->members).
      super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (params->members).
      super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    return sVar1;
  }
  this = (TypeError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"expected 1 arguments to IfcClosedShell",&local_39);
  TypeError::TypeError(this,&local_38,0xffffffffffffffff,0xffffffffffffffff);
  __cxa_throw(this,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t GenericFill<IfcClosedShell>(const DB& db, const LIST& params, IfcClosedShell* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcConnectedFaceSet*>(in));
	if (params.GetSize() < 1) { throw STEP::TypeError("expected 1 arguments to IfcClosedShell"); }	return base;
}